

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 (*pauVar18) [16];
  byte bVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  byte bVar25;
  undefined1 (*pauVar26) [16];
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  long lVar31;
  byte bVar32;
  undefined4 uVar33;
  ulong unaff_R15;
  size_t i;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar57;
  undefined1 auVar53 [32];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar54 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  float fVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 in_ZMM5 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar75 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  undefined1 local_23e0 [32];
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  undefined1 local_23a0 [8];
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar49 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_23a0 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar75 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar35 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar75 = ZEXT1664(auVar35);
  }
  pauVar29 = (undefined1 (*) [16])local_2390;
  local_24c0 = *(float *)&(query->p).field_0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  local_24e0 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_24dc = local_24e0;
  fStack_24d8 = local_24e0;
  fStack_24d4 = local_24e0;
  fStack_24d0 = local_24e0;
  fStack_24cc = local_24e0;
  fStack_24c8 = local_24e0;
  fStack_24c4 = local_24e0;
  local_2500 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_24fc = local_2500;
  fStack_24f8 = local_2500;
  fStack_24f4 = local_2500;
  fStack_24f0 = local_2500;
  fStack_24ec = local_2500;
  fStack_24e8 = local_2500;
  fStack_24e4 = local_2500;
  uVar33 = *(undefined4 *)&(context->query_radius).field_0;
  auVar37._4_4_ = uVar33;
  auVar37._0_4_ = uVar33;
  auVar37._8_4_ = uVar33;
  auVar37._12_4_ = uVar33;
  auVar37._16_4_ = uVar33;
  auVar37._20_4_ = uVar33;
  auVar37._24_4_ = uVar33;
  auVar37._28_4_ = uVar33;
  uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar40._4_4_ = uVar33;
  auVar40._0_4_ = uVar33;
  auVar40._8_4_ = uVar33;
  auVar40._12_4_ = uVar33;
  auVar40._16_4_ = uVar33;
  auVar40._20_4_ = uVar33;
  auVar40._24_4_ = uVar33;
  auVar40._28_4_ = uVar33;
  uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar45._4_4_ = uVar33;
  auVar45._0_4_ = uVar33;
  auVar45._8_4_ = uVar33;
  auVar45._12_4_ = uVar33;
  auVar45._16_4_ = uVar33;
  auVar45._20_4_ = uVar33;
  auVar45._24_4_ = uVar33;
  auVar45._28_4_ = uVar33;
  bVar21 = false;
  do {
    auVar49 = ZEXT3264(auVar45);
    auVar12._4_4_ = fStack_24bc;
    auVar12._0_4_ = local_24c0;
    auVar12._8_4_ = fStack_24b8;
    auVar12._12_4_ = fStack_24b4;
    auVar12._16_4_ = fStack_24b0;
    auVar12._20_4_ = fStack_24ac;
    auVar12._24_4_ = fStack_24a8;
    auVar12._28_4_ = fStack_24a4;
    local_23e0 = vsubps_avx(auVar12,auVar37);
    fVar50 = auVar37._0_4_;
    fVar55 = auVar37._4_4_;
    fVar56 = auVar37._8_4_;
    fVar57 = auVar37._12_4_;
    fVar58 = auVar37._16_4_;
    fVar59 = auVar37._20_4_;
    fVar60 = auVar37._24_4_;
    local_2400 = local_24c0 + fVar50;
    fStack_23fc = fStack_24bc + fVar55;
    fStack_23f8 = fStack_24b8 + fVar56;
    fStack_23f4 = fStack_24b4 + fVar57;
    fStack_23f0 = fStack_24b0 + fVar58;
    fStack_23ec = fStack_24ac + fVar59;
    fStack_23e8 = fStack_24a8 + fVar60;
    fStack_23e4 = fStack_24a4 + auVar37._28_4_;
    auVar9._4_4_ = fStack_24dc;
    auVar9._0_4_ = local_24e0;
    auVar9._8_4_ = fStack_24d8;
    auVar9._12_4_ = fStack_24d4;
    auVar9._16_4_ = fStack_24d0;
    auVar9._20_4_ = fStack_24cc;
    auVar9._24_4_ = fStack_24c8;
    auVar9._28_4_ = fStack_24c4;
    local_2420 = vsubps_avx(auVar9,auVar40);
    auVar63 = ZEXT3264(local_2420);
    local_2440 = local_24e0 + auVar40._0_4_;
    fStack_243c = fStack_24dc + auVar40._4_4_;
    fStack_2438 = fStack_24d8 + auVar40._8_4_;
    fStack_2434 = fStack_24d4 + auVar40._12_4_;
    fStack_2430 = fStack_24d0 + auVar40._16_4_;
    fStack_242c = fStack_24cc + auVar40._20_4_;
    fStack_2428 = fStack_24c8 + auVar40._24_4_;
    fStack_2424 = fStack_24c4 + auVar40._28_4_;
    auVar5._4_4_ = fStack_24fc;
    auVar5._0_4_ = local_2500;
    auVar5._8_4_ = fStack_24f8;
    auVar5._12_4_ = fStack_24f4;
    auVar5._16_4_ = fStack_24f0;
    auVar5._20_4_ = fStack_24ec;
    auVar5._24_4_ = fStack_24e8;
    auVar5._28_4_ = fStack_24e4;
    local_2460 = vsubps_avx(auVar5,auVar45);
    auVar54 = ZEXT3264(local_2460);
    local_2480._0_4_ = local_2500 + auVar45._0_4_;
    local_2480._4_4_ = fStack_24fc + auVar45._4_4_;
    local_2480._8_4_ = fStack_24f8 + auVar45._8_4_;
    local_2480._12_4_ = fStack_24f4 + auVar45._12_4_;
    local_2480._16_4_ = fStack_24f0 + auVar45._16_4_;
    local_2480._20_4_ = fStack_24ec + auVar45._20_4_;
    local_2480._24_4_ = fStack_24e8 + auVar45._24_4_;
    local_2480._28_4_ = fStack_24e4 + auVar45._28_4_;
    auVar43 = ZEXT3264(local_2480);
    local_23c0 = fVar50 * fVar50;
    fStack_23bc = fVar55 * fVar55;
    fStack_23b8 = fVar56 * fVar56;
    fStack_23b4 = fVar57 * fVar57;
    fStack_23b0 = fVar58 * fVar58;
    fStack_23ac = fVar59 * fVar59;
    fStack_23a8 = fVar60 * fVar60;
    fStack_23a4 = auVar37._28_4_;
    local_2490 = auVar75._0_16_;
    do {
      do {
        do {
          if (pauVar29 == (undefined1 (*) [16])local_23a0) {
            return bVar21;
          }
          pauVar18 = pauVar29 + -1;
          pauVar29 = pauVar29 + -1;
        } while (auVar75._0_4_ < *(float *)(*pauVar18 + 8));
        uVar30 = *(ulong *)*pauVar29;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar30 & 8) == 0) {
              uVar23 = uVar30 & 0xfffffffffffffff0;
              fVar50 = query->time;
              auVar38._4_4_ = fVar50;
              auVar38._0_4_ = fVar50;
              auVar38._8_4_ = fVar50;
              auVar38._12_4_ = fVar50;
              auVar38._16_4_ = fVar50;
              auVar38._20_4_ = fVar50;
              auVar38._24_4_ = fVar50;
              auVar38._28_4_ = fVar50;
              auVar41._0_4_ = fVar50 * *(float *)(uVar23 + 0x100) + *(float *)(uVar23 + 0x40);
              auVar41._4_4_ = fVar50 * *(float *)(uVar23 + 0x104) + *(float *)(uVar23 + 0x44);
              auVar41._8_4_ = fVar50 * *(float *)(uVar23 + 0x108) + *(float *)(uVar23 + 0x48);
              auVar41._12_4_ = fVar50 * *(float *)(uVar23 + 0x10c) + *(float *)(uVar23 + 0x4c);
              auVar41._16_4_ = fVar50 * *(float *)(uVar23 + 0x110) + *(float *)(uVar23 + 0x50);
              auVar41._20_4_ = fVar50 * *(float *)(uVar23 + 0x114) + *(float *)(uVar23 + 0x54);
              auVar41._24_4_ = fVar50 * *(float *)(uVar23 + 0x118) + *(float *)(uVar23 + 0x58);
              auVar41._28_4_ = auVar43._28_4_ + *(float *)(uVar23 + 0x5c);
              auVar46._0_4_ = fVar50 * *(float *)(uVar23 + 0x140) + *(float *)(uVar23 + 0x80);
              auVar46._4_4_ = fVar50 * *(float *)(uVar23 + 0x144) + *(float *)(uVar23 + 0x84);
              auVar46._8_4_ = fVar50 * *(float *)(uVar23 + 0x148) + *(float *)(uVar23 + 0x88);
              auVar46._12_4_ = fVar50 * *(float *)(uVar23 + 0x14c) + *(float *)(uVar23 + 0x8c);
              auVar46._16_4_ = fVar50 * *(float *)(uVar23 + 0x150) + *(float *)(uVar23 + 0x90);
              auVar46._20_4_ = fVar50 * *(float *)(uVar23 + 0x154) + *(float *)(uVar23 + 0x94);
              auVar46._24_4_ = fVar50 * *(float *)(uVar23 + 0x158) + *(float *)(uVar23 + 0x98);
              auVar46._28_4_ = auVar49._28_4_ + *(float *)(uVar23 + 0x9c);
              auVar52._0_4_ = fVar50 * *(float *)(uVar23 + 0x180) + *(float *)(uVar23 + 0xc0);
              auVar52._4_4_ = fVar50 * *(float *)(uVar23 + 0x184) + *(float *)(uVar23 + 0xc4);
              auVar52._8_4_ = fVar50 * *(float *)(uVar23 + 0x188) + *(float *)(uVar23 + 200);
              auVar52._12_4_ = fVar50 * *(float *)(uVar23 + 0x18c) + *(float *)(uVar23 + 0xcc);
              auVar52._16_4_ = fVar50 * *(float *)(uVar23 + 400) + *(float *)(uVar23 + 0xd0);
              auVar52._20_4_ = fVar50 * *(float *)(uVar23 + 0x194) + *(float *)(uVar23 + 0xd4);
              auVar52._24_4_ = fVar50 * *(float *)(uVar23 + 0x198) + *(float *)(uVar23 + 0xd8);
              auVar52._28_4_ = auVar54._28_4_ + *(float *)(uVar23 + 0xdc);
              auVar61._0_4_ = fVar50 * *(float *)(uVar23 + 0x120) + *(float *)(uVar23 + 0x60);
              auVar61._4_4_ = fVar50 * *(float *)(uVar23 + 0x124) + *(float *)(uVar23 + 100);
              auVar61._8_4_ = fVar50 * *(float *)(uVar23 + 0x128) + *(float *)(uVar23 + 0x68);
              auVar61._12_4_ = fVar50 * *(float *)(uVar23 + 300) + *(float *)(uVar23 + 0x6c);
              auVar61._16_4_ = fVar50 * *(float *)(uVar23 + 0x130) + *(float *)(uVar23 + 0x70);
              auVar61._20_4_ = fVar50 * *(float *)(uVar23 + 0x134) + *(float *)(uVar23 + 0x74);
              auVar61._24_4_ = fVar50 * *(float *)(uVar23 + 0x138) + *(float *)(uVar23 + 0x78);
              auVar61._28_4_ = auVar63._28_4_ + *(float *)(uVar23 + 0x7c);
              auVar63 = ZEXT3264(auVar61);
              auVar65._0_4_ = fVar50 * *(float *)(uVar23 + 0x160) + *(float *)(uVar23 + 0xa0);
              auVar65._4_4_ = fVar50 * *(float *)(uVar23 + 0x164) + *(float *)(uVar23 + 0xa4);
              auVar65._8_4_ = fVar50 * *(float *)(uVar23 + 0x168) + *(float *)(uVar23 + 0xa8);
              auVar65._12_4_ = fVar50 * *(float *)(uVar23 + 0x16c) + *(float *)(uVar23 + 0xac);
              auVar65._16_4_ = fVar50 * *(float *)(uVar23 + 0x170) + *(float *)(uVar23 + 0xb0);
              auVar65._20_4_ = fVar50 * *(float *)(uVar23 + 0x174) + *(float *)(uVar23 + 0xb4);
              auVar65._24_4_ = fVar50 * *(float *)(uVar23 + 0x178) + *(float *)(uVar23 + 0xb8);
              auVar65._28_4_ = in_ZMM5._28_4_ + *(float *)(uVar23 + 0xbc);
              auVar73._0_4_ = fVar50 * *(float *)(uVar23 + 0x1a0) + *(float *)(uVar23 + 0xe0);
              auVar73._4_4_ = fVar50 * *(float *)(uVar23 + 0x1a4) + *(float *)(uVar23 + 0xe4);
              auVar73._8_4_ = fVar50 * *(float *)(uVar23 + 0x1a8) + *(float *)(uVar23 + 0xe8);
              auVar73._12_4_ = fVar50 * *(float *)(uVar23 + 0x1ac) + *(float *)(uVar23 + 0xec);
              auVar73._16_4_ = fVar50 * *(float *)(uVar23 + 0x1b0) + *(float *)(uVar23 + 0xf0);
              auVar73._20_4_ = fVar50 * *(float *)(uVar23 + 0x1b4) + *(float *)(uVar23 + 0xf4);
              auVar73._24_4_ = fVar50 * *(float *)(uVar23 + 0x1b8) + *(float *)(uVar23 + 0xf8);
              auVar73._28_4_ = in_ZMM6._28_4_ + *(float *)(uVar23 + 0xfc);
              in_ZMM6 = ZEXT3264(auVar73);
              auVar13._4_4_ = fStack_24bc;
              auVar13._0_4_ = local_24c0;
              auVar13._8_4_ = fStack_24b8;
              auVar13._12_4_ = fStack_24b4;
              auVar13._16_4_ = fStack_24b0;
              auVar13._20_4_ = fStack_24ac;
              auVar13._24_4_ = fStack_24a8;
              auVar13._28_4_ = fStack_24a4;
              auVar37 = vmaxps_avx(auVar13,auVar41);
              auVar37 = vminps_avx(auVar37,auVar61);
              auVar40 = vsubps_avx(auVar37,auVar13);
              auVar10._4_4_ = fStack_24dc;
              auVar10._0_4_ = local_24e0;
              auVar10._8_4_ = fStack_24d8;
              auVar10._12_4_ = fStack_24d4;
              auVar10._16_4_ = fStack_24d0;
              auVar10._20_4_ = fStack_24cc;
              auVar10._24_4_ = fStack_24c8;
              auVar10._28_4_ = fStack_24c4;
              auVar37 = vmaxps_avx(auVar10,auVar46);
              auVar37 = vminps_avx(auVar37,auVar65);
              auVar45 = vsubps_avx(auVar37,auVar10);
              auVar7._4_4_ = fStack_24fc;
              auVar7._0_4_ = local_2500;
              auVar7._8_4_ = fStack_24f8;
              auVar7._12_4_ = fStack_24f4;
              auVar7._16_4_ = fStack_24f0;
              auVar7._20_4_ = fStack_24ec;
              auVar7._24_4_ = fStack_24e8;
              auVar7._28_4_ = fStack_24e4;
              auVar37 = vmaxps_avx(auVar7,auVar52);
              auVar37 = vminps_avx(auVar37,auVar73);
              auVar37 = vsubps_avx(auVar37,auVar7);
              fVar64 = auVar40._0_4_ * auVar40._0_4_;
              fVar67 = auVar40._4_4_ * auVar40._4_4_;
              fVar68 = auVar40._8_4_ * auVar40._8_4_;
              fVar69 = auVar40._12_4_ * auVar40._12_4_;
              fVar70 = auVar40._16_4_ * auVar40._16_4_;
              fVar71 = auVar40._20_4_ * auVar40._20_4_;
              fVar72 = auVar40._24_4_ * auVar40._24_4_;
              in_ZMM5 = ZEXT3264(CONCAT428(fStack_24e4,
                                           CONCAT424(fVar72,CONCAT420(fVar71,CONCAT416(fVar70,
                                                  CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,
                                                  fVar64))))))));
              fVar50 = auVar37._0_4_ * auVar37._0_4_;
              fVar55 = auVar37._4_4_ * auVar37._4_4_;
              fVar56 = auVar37._8_4_ * auVar37._8_4_;
              fVar57 = auVar37._12_4_ * auVar37._12_4_;
              fVar58 = auVar37._16_4_ * auVar37._16_4_;
              fVar59 = auVar37._20_4_ * auVar37._20_4_;
              fVar60 = auVar37._24_4_ * auVar37._24_4_;
              auVar54 = ZEXT3264(CONCAT428(auVar37._28_4_,
                                           CONCAT424(fVar60,CONCAT420(fVar59,CONCAT416(fVar58,
                                                  CONCAT412(fVar57,CONCAT48(fVar56,CONCAT44(fVar55,
                                                  fVar50))))))));
              local_2520._0_4_ = fVar64 + auVar45._0_4_ * auVar45._0_4_ + fVar50;
              local_2520._4_4_ = fVar67 + auVar45._4_4_ * auVar45._4_4_ + fVar55;
              fStack_2518 = fVar68 + auVar45._8_4_ * auVar45._8_4_ + fVar56;
              fStack_2514 = fVar69 + auVar45._12_4_ * auVar45._12_4_ + fVar57;
              fStack_2510 = fVar70 + auVar45._16_4_ * auVar45._16_4_ + fVar58;
              fStack_250c = fVar71 + auVar45._20_4_ * auVar45._20_4_ + fVar59;
              fStack_2508 = fVar72 + auVar45._24_4_ * auVar45._24_4_ + fVar60;
              fStack_2504 = fStack_24e4 + auVar45._28_4_ + auVar37._28_4_;
              auVar17._4_4_ = fStack_23bc;
              auVar17._0_4_ = local_23c0;
              auVar17._8_4_ = fStack_23b8;
              auVar17._12_4_ = fStack_23b4;
              auVar17._16_4_ = fStack_23b0;
              auVar17._20_4_ = fStack_23ac;
              auVar17._24_4_ = fStack_23a8;
              auVar17._28_4_ = fStack_23a4;
              auVar40 = vcmpps_avx(_local_2520,auVar17,2);
              auVar37 = vcmpps_avx(auVar41,auVar61,2);
              auVar37 = vandps_avx(auVar40,auVar37);
              if (((uint)uVar30 & 7) == 6) {
                auVar35 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
                goto LAB_015b563c;
              }
LAB_015b547b:
              auVar49 = ZEXT3264(auVar40);
              auVar43 = ZEXT3264(auVar37);
              uVar33 = vmovmskps_avx(auVar37);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar33);
            }
          }
          else if ((uVar30 & 8) == 0) {
            uVar23 = uVar30 & 0xfffffffffffffff0;
            fVar50 = query->time;
            auVar38._4_4_ = fVar50;
            auVar38._0_4_ = fVar50;
            auVar38._8_4_ = fVar50;
            auVar38._12_4_ = fVar50;
            auVar38._16_4_ = fVar50;
            auVar38._20_4_ = fVar50;
            auVar38._24_4_ = fVar50;
            auVar38._28_4_ = fVar50;
            auVar42._0_4_ = fVar50 * *(float *)(uVar23 + 0x100) + *(float *)(uVar23 + 0x40);
            auVar42._4_4_ = fVar50 * *(float *)(uVar23 + 0x104) + *(float *)(uVar23 + 0x44);
            auVar42._8_4_ = fVar50 * *(float *)(uVar23 + 0x108) + *(float *)(uVar23 + 0x48);
            auVar42._12_4_ = fVar50 * *(float *)(uVar23 + 0x10c) + *(float *)(uVar23 + 0x4c);
            auVar42._16_4_ = fVar50 * *(float *)(uVar23 + 0x110) + *(float *)(uVar23 + 0x50);
            auVar42._20_4_ = fVar50 * *(float *)(uVar23 + 0x114) + *(float *)(uVar23 + 0x54);
            auVar42._24_4_ = fVar50 * *(float *)(uVar23 + 0x118) + *(float *)(uVar23 + 0x58);
            auVar42._28_4_ = auVar43._28_4_ + *(float *)(uVar23 + 0x5c);
            auVar47._0_4_ = fVar50 * *(float *)(uVar23 + 0x140) + *(float *)(uVar23 + 0x80);
            auVar47._4_4_ = fVar50 * *(float *)(uVar23 + 0x144) + *(float *)(uVar23 + 0x84);
            auVar47._8_4_ = fVar50 * *(float *)(uVar23 + 0x148) + *(float *)(uVar23 + 0x88);
            auVar47._12_4_ = fVar50 * *(float *)(uVar23 + 0x14c) + *(float *)(uVar23 + 0x8c);
            auVar47._16_4_ = fVar50 * *(float *)(uVar23 + 0x150) + *(float *)(uVar23 + 0x90);
            auVar47._20_4_ = fVar50 * *(float *)(uVar23 + 0x154) + *(float *)(uVar23 + 0x94);
            auVar47._24_4_ = fVar50 * *(float *)(uVar23 + 0x158) + *(float *)(uVar23 + 0x98);
            auVar47._28_4_ = auVar49._28_4_ + *(float *)(uVar23 + 0x9c);
            auVar53._0_4_ = fVar50 * *(float *)(uVar23 + 0x180) + *(float *)(uVar23 + 0xc0);
            auVar53._4_4_ = fVar50 * *(float *)(uVar23 + 0x184) + *(float *)(uVar23 + 0xc4);
            auVar53._8_4_ = fVar50 * *(float *)(uVar23 + 0x188) + *(float *)(uVar23 + 200);
            auVar53._12_4_ = fVar50 * *(float *)(uVar23 + 0x18c) + *(float *)(uVar23 + 0xcc);
            auVar53._16_4_ = fVar50 * *(float *)(uVar23 + 400) + *(float *)(uVar23 + 0xd0);
            auVar53._20_4_ = fVar50 * *(float *)(uVar23 + 0x194) + *(float *)(uVar23 + 0xd4);
            auVar53._24_4_ = fVar50 * *(float *)(uVar23 + 0x198) + *(float *)(uVar23 + 0xd8);
            auVar53._28_4_ = auVar54._28_4_ + *(float *)(uVar23 + 0xdc);
            auVar62._0_4_ = fVar50 * *(float *)(uVar23 + 0x120) + *(float *)(uVar23 + 0x60);
            auVar62._4_4_ = fVar50 * *(float *)(uVar23 + 0x124) + *(float *)(uVar23 + 100);
            auVar62._8_4_ = fVar50 * *(float *)(uVar23 + 0x128) + *(float *)(uVar23 + 0x68);
            auVar62._12_4_ = fVar50 * *(float *)(uVar23 + 300) + *(float *)(uVar23 + 0x6c);
            auVar62._16_4_ = fVar50 * *(float *)(uVar23 + 0x130) + *(float *)(uVar23 + 0x70);
            auVar62._20_4_ = fVar50 * *(float *)(uVar23 + 0x134) + *(float *)(uVar23 + 0x74);
            auVar62._24_4_ = fVar50 * *(float *)(uVar23 + 0x138) + *(float *)(uVar23 + 0x78);
            auVar62._28_4_ = auVar63._28_4_ + *(float *)(uVar23 + 0x7c);
            auVar66._0_4_ = fVar50 * *(float *)(uVar23 + 0x160) + *(float *)(uVar23 + 0xa0);
            auVar66._4_4_ = fVar50 * *(float *)(uVar23 + 0x164) + *(float *)(uVar23 + 0xa4);
            auVar66._8_4_ = fVar50 * *(float *)(uVar23 + 0x168) + *(float *)(uVar23 + 0xa8);
            auVar66._12_4_ = fVar50 * *(float *)(uVar23 + 0x16c) + *(float *)(uVar23 + 0xac);
            auVar66._16_4_ = fVar50 * *(float *)(uVar23 + 0x170) + *(float *)(uVar23 + 0xb0);
            auVar66._20_4_ = fVar50 * *(float *)(uVar23 + 0x174) + *(float *)(uVar23 + 0xb4);
            auVar66._24_4_ = fVar50 * *(float *)(uVar23 + 0x178) + *(float *)(uVar23 + 0xb8);
            auVar66._28_4_ = in_ZMM5._28_4_ + *(float *)(uVar23 + 0xbc);
            in_ZMM5 = ZEXT3264(auVar66);
            auVar74._0_4_ = fVar50 * *(float *)(uVar23 + 0x1a0) + *(float *)(uVar23 + 0xe0);
            auVar74._4_4_ = fVar50 * *(float *)(uVar23 + 0x1a4) + *(float *)(uVar23 + 0xe4);
            auVar74._8_4_ = fVar50 * *(float *)(uVar23 + 0x1a8) + *(float *)(uVar23 + 0xe8);
            auVar74._12_4_ = fVar50 * *(float *)(uVar23 + 0x1ac) + *(float *)(uVar23 + 0xec);
            auVar74._16_4_ = fVar50 * *(float *)(uVar23 + 0x1b0) + *(float *)(uVar23 + 0xf0);
            auVar74._20_4_ = fVar50 * *(float *)(uVar23 + 0x1b4) + *(float *)(uVar23 + 0xf4);
            auVar74._24_4_ = fVar50 * *(float *)(uVar23 + 0x1b8) + *(float *)(uVar23 + 0xf8);
            auVar74._28_4_ = in_ZMM6._28_4_ + *(float *)(uVar23 + 0xfc);
            in_ZMM6 = ZEXT3264(auVar74);
            auVar14._4_4_ = fStack_24bc;
            auVar14._0_4_ = local_24c0;
            auVar14._8_4_ = fStack_24b8;
            auVar14._12_4_ = fStack_24b4;
            auVar14._16_4_ = fStack_24b0;
            auVar14._20_4_ = fStack_24ac;
            auVar14._24_4_ = fStack_24a8;
            auVar14._28_4_ = fStack_24a4;
            auVar37 = vmaxps_avx(auVar14,auVar42);
            auVar37 = vminps_avx(auVar37,auVar62);
            auVar40 = vsubps_avx(auVar37,auVar14);
            auVar11._4_4_ = fStack_24dc;
            auVar11._0_4_ = local_24e0;
            auVar11._8_4_ = fStack_24d8;
            auVar11._12_4_ = fStack_24d4;
            auVar11._16_4_ = fStack_24d0;
            auVar11._20_4_ = fStack_24cc;
            auVar11._24_4_ = fStack_24c8;
            auVar11._28_4_ = fStack_24c4;
            auVar37 = vmaxps_avx(auVar11,auVar47);
            auVar37 = vminps_avx(auVar37,auVar66);
            auVar45 = vsubps_avx(auVar37,auVar11);
            auVar8._4_4_ = fStack_24fc;
            auVar8._0_4_ = local_2500;
            auVar8._8_4_ = fStack_24f8;
            auVar8._12_4_ = fStack_24f4;
            auVar8._16_4_ = fStack_24f0;
            auVar8._20_4_ = fStack_24ec;
            auVar8._24_4_ = fStack_24e8;
            auVar8._28_4_ = fStack_24e4;
            auVar37 = vmaxps_avx(auVar8,auVar53);
            auVar37 = vminps_avx(auVar37,auVar74);
            auVar37 = vsubps_avx(auVar37,auVar8);
            local_2520._4_4_ =
                 auVar37._4_4_ * auVar37._4_4_ +
                 auVar45._4_4_ * auVar45._4_4_ + auVar40._4_4_ * auVar40._4_4_;
            local_2520._0_4_ =
                 auVar37._0_4_ * auVar37._0_4_ +
                 auVar45._0_4_ * auVar45._0_4_ + auVar40._0_4_ * auVar40._0_4_;
            fStack_2518 = auVar37._8_4_ * auVar37._8_4_ +
                          auVar45._8_4_ * auVar45._8_4_ + auVar40._8_4_ * auVar40._8_4_;
            fStack_2514 = auVar37._12_4_ * auVar37._12_4_ +
                          auVar45._12_4_ * auVar45._12_4_ + auVar40._12_4_ * auVar40._12_4_;
            fStack_2510 = auVar37._16_4_ * auVar37._16_4_ +
                          auVar45._16_4_ * auVar45._16_4_ + auVar40._16_4_ * auVar40._16_4_;
            fStack_250c = auVar37._20_4_ * auVar37._20_4_ +
                          auVar45._20_4_ * auVar45._20_4_ + auVar40._20_4_ * auVar40._20_4_;
            fStack_2508 = auVar37._24_4_ * auVar37._24_4_ +
                          auVar45._24_4_ * auVar45._24_4_ + auVar40._24_4_ * auVar40._24_4_;
            fStack_2504 = auVar37._28_4_ + auVar45._28_4_ + auVar40._28_4_;
            auVar16._4_4_ = fStack_23fc;
            auVar16._0_4_ = local_2400;
            auVar16._8_4_ = fStack_23f8;
            auVar16._12_4_ = fStack_23f4;
            auVar16._16_4_ = fStack_23f0;
            auVar16._20_4_ = fStack_23ec;
            auVar16._24_4_ = fStack_23e8;
            auVar16._28_4_ = fStack_23e4;
            auVar37 = vcmpps_avx(auVar42,auVar16,2);
            auVar15._4_4_ = fStack_243c;
            auVar15._0_4_ = local_2440;
            auVar15._8_4_ = fStack_2438;
            auVar15._12_4_ = fStack_2434;
            auVar15._16_4_ = fStack_2430;
            auVar15._20_4_ = fStack_242c;
            auVar15._24_4_ = fStack_2428;
            auVar15._28_4_ = fStack_2424;
            auVar40 = vcmpps_avx(auVar47,auVar15,2);
            auVar37 = vandps_avx(auVar40,auVar37);
            auVar45 = vcmpps_avx(auVar42,auVar62,2);
            auVar40 = vcmpps_avx(auVar53,local_2480,2);
            auVar5 = vcmpps_avx(auVar62,local_23e0,5);
            auVar63 = ZEXT3264(auVar5);
            auVar40 = vandps_avx(auVar40,auVar5);
            auVar40 = vandps_avx(auVar37,auVar40);
            auVar37 = vcmpps_avx(auVar66,local_2420,5);
            auVar37 = vandps_avx(auVar45,auVar37);
            auVar45 = vcmpps_avx(auVar74,local_2460,5);
            auVar54 = ZEXT3264(auVar45);
            auVar37 = vandps_avx(auVar37,auVar45);
            auVar37 = vandps_avx(auVar40,auVar37);
            if (((uint)uVar30 & 7) != 6) goto LAB_015b547b;
            auVar48._8_4_ = 0xffff;
            auVar48._0_8_ = 0xffff0000ffff;
            auVar48._12_4_ = 0xffff;
            auVar48._16_4_ = 0xffff;
            auVar48._20_4_ = 0xffff;
            auVar48._24_4_ = 0xffff;
            auVar48._28_4_ = 0xffff;
            auVar37 = vandps_avx(auVar37,auVar48);
            auVar35 = vpackusdw_avx(auVar37._0_16_,auVar37._16_16_);
LAB_015b563c:
            auVar43 = ZEXT1664(auVar35);
            auVar37 = vcmpps_avx(*(undefined1 (*) [32])((uVar30 & 0xfffffffffffffff0) + 0x1c0),
                                 auVar38,2);
            auVar40 = vcmpps_avx(auVar38,*(undefined1 (*) [32])
                                          ((uVar30 & 0xfffffffffffffff0) + 0x1e0),1);
            auVar37 = vandps_avx(auVar37,auVar40);
            auVar49 = ZEXT1664(auVar37._16_16_);
            auVar39 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
            auVar35 = vpand_avx(auVar39,auVar35);
            auVar35 = vpsllw_avx(auVar35,0xf);
            auVar35 = vpacksswb_avx(auVar35,auVar35);
            unaff_R15 = (ulong)(byte)(SUB161(auVar35 >> 7,0) & 1 |
                                      (SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar35 >> 0x3f,0) << 7);
          }
          if ((uVar30 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar22 = 4;
            }
            else {
              uVar23 = uVar30 & 0xfffffffffffffff0;
              lVar24 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              iVar22 = 0;
              uVar30 = *(ulong *)(uVar23 + lVar24 * 8);
              uVar28 = unaff_R15 - 1 & unaff_R15;
              if (uVar28 != 0) {
                uVar3 = *(uint *)(local_2520 + lVar24 * 4);
                lVar24 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar23 + lVar24 * 8);
                uVar2 = *(uint *)(local_2520 + lVar24 * 4);
                uVar28 = uVar28 - 1 & uVar28;
                if (uVar28 == 0) {
                  if (uVar3 < uVar2) {
                    *(ulong *)*pauVar29 = uVar4;
                    *(uint *)(*pauVar29 + 8) = uVar2;
                    pauVar29 = pauVar29 + 1;
                  }
                  else {
                    *(ulong *)*pauVar29 = uVar30;
                    *(uint *)(*pauVar29 + 8) = uVar3;
                    pauVar29 = pauVar29 + 1;
                    uVar30 = uVar4;
                  }
                }
                else {
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = uVar30;
                  auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar3));
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar4;
                  auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar2));
                  lVar24 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
                  auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_2520 + lVar24 * 4)));
                  auVar49 = ZEXT1664(auVar44);
                  uVar28 = uVar28 - 1 & uVar28;
                  if (uVar28 == 0) {
                    auVar51 = vpcmpgtd_avx(auVar39,auVar35);
                    auVar36 = vpshufd_avx(auVar51,0xaa);
                    auVar51 = vblendvps_avx(auVar39,auVar35,auVar36);
                    auVar35 = vblendvps_avx(auVar35,auVar39,auVar36);
                    auVar39 = vpcmpgtd_avx(auVar44,auVar51);
                    auVar36 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar44,auVar51,auVar36);
                    auVar54 = ZEXT1664(auVar39);
                    auVar44 = vblendvps_avx(auVar51,auVar44,auVar36);
                    auVar43 = ZEXT1664(auVar44);
                    auVar51 = vpcmpgtd_avx(auVar44,auVar35);
                    auVar36 = vpshufd_avx(auVar51,0xaa);
                    auVar49 = ZEXT1664(auVar36);
                    auVar51 = vblendvps_avx(auVar44,auVar35,auVar36);
                    auVar63 = ZEXT1664(auVar51);
                    auVar35 = vblendvps_avx(auVar35,auVar44,auVar36);
                    *pauVar29 = auVar35;
                    pauVar29[1] = auVar51;
                    pauVar29 = pauVar29 + 2;
                    uVar30 = auVar39._0_8_;
                  }
                  else {
                    lVar24 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                      }
                    }
                    auVar63 = ZEXT464(*(uint *)(local_2520 + lVar24 * 4));
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
                    auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_2520 + lVar24 * 4)));
                    auVar54 = ZEXT1664(auVar51);
                    uVar28 = uVar28 - 1 & uVar28;
                    iVar22 = 0;
                    if (uVar28 == 0) {
                      auVar36 = vpcmpgtd_avx(auVar39,auVar35);
                      auVar6 = vpshufd_avx(auVar36,0xaa);
                      auVar36 = vblendvps_avx(auVar39,auVar35,auVar6);
                      auVar35 = vblendvps_avx(auVar35,auVar39,auVar6);
                      auVar39 = vpcmpgtd_avx(auVar51,auVar44);
                      auVar6 = vpshufd_avx(auVar39,0xaa);
                      auVar39 = vblendvps_avx(auVar51,auVar44,auVar6);
                      auVar44 = vblendvps_avx(auVar44,auVar51,auVar6);
                      auVar51 = vpcmpgtd_avx(auVar44,auVar35);
                      auVar6 = vpshufd_avx(auVar51,0xaa);
                      auVar51 = vblendvps_avx(auVar44,auVar35,auVar6);
                      auVar54 = ZEXT1664(auVar51);
                      auVar35 = vblendvps_avx(auVar35,auVar44,auVar6);
                      auVar44 = vpcmpgtd_avx(auVar39,auVar36);
                      auVar6 = vpshufd_avx(auVar44,0xaa);
                      auVar44 = vblendvps_avx(auVar39,auVar36,auVar6);
                      auVar49 = ZEXT1664(auVar44);
                      auVar39 = vblendvps_avx(auVar36,auVar39,auVar6);
                      auVar36 = vpcmpgtd_avx(auVar51,auVar39);
                      auVar6 = vpshufd_avx(auVar36,0xaa);
                      auVar63 = ZEXT1664(auVar6);
                      auVar36 = vblendvps_avx(auVar51,auVar39,auVar6);
                      in_ZMM5 = ZEXT1664(auVar36);
                      auVar39 = vblendvps_avx(auVar39,auVar51,auVar6);
                      auVar43 = ZEXT1664(auVar39);
                      *pauVar29 = auVar35;
                      pauVar29[1] = auVar39;
                      pauVar29[2] = auVar36;
                      pauVar29 = pauVar29 + 3;
                      uVar30 = auVar44._0_8_;
                    }
                    else {
                      *pauVar29 = auVar35;
                      pauVar29[1] = auVar39;
                      pauVar29[2] = auVar44;
                      pauVar29[3] = auVar51;
                      lVar24 = 0x30;
                      do {
                        lVar31 = lVar24;
                        lVar24 = 0;
                        if (uVar28 != 0) {
                          for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                          }
                        }
                        auVar43 = ZEXT464(*(uint *)(local_2520 + lVar24 * 4));
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
                        auVar35 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_2520 + lVar24 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar29[1] + lVar31) = auVar35;
                        uVar28 = uVar28 & uVar28 - 1;
                        lVar24 = lVar31 + 0x10;
                      } while (uVar28 != 0);
                      pauVar18 = (undefined1 (*) [16])(pauVar29[1] + lVar31);
                      if (lVar31 + 0x10 != 0) {
                        lVar24 = 0x10;
                        pauVar26 = pauVar29;
                        do {
                          auVar35 = pauVar26[1];
                          uVar3 = *(uint *)(pauVar26[1] + 8);
                          pauVar26 = pauVar26 + 1;
                          lVar31 = lVar24;
                          do {
                            if (uVar3 <= *(uint *)(pauVar29[-1] + lVar31 + 8)) {
                              pauVar27 = (undefined1 (*) [16])(*pauVar29 + lVar31);
                              break;
                            }
                            auVar43 = ZEXT1664(*(undefined1 (*) [16])(pauVar29[-1] + lVar31));
                            *(undefined1 (*) [16])(*pauVar29 + lVar31) =
                                 *(undefined1 (*) [16])(pauVar29[-1] + lVar31);
                            lVar31 = lVar31 + -0x10;
                            pauVar27 = pauVar29;
                          } while (lVar31 != 0);
                          *pauVar27 = auVar35;
                          lVar24 = lVar24 + 0x10;
                        } while (pauVar18 != pauVar26);
                      }
                      pauVar29 = pauVar18;
                      uVar30 = *(ulong *)*pauVar18;
                    }
                  }
                }
              }
            }
          }
          else {
            iVar22 = 6;
          }
        } while (iVar22 == 0);
      } while ((iVar22 != 6) || (uVar23 = (ulong)((uint)uVar30 & 0xf), uVar23 == 8));
      lVar31 = (uVar30 & 0xfffffffffffffff0) + 0x40;
      lVar24 = 0;
      bVar19 = 0;
      do {
        bVar25 = bVar19;
        bVar32 = 0;
        lVar34 = 0;
        do {
          if (*(int *)(lVar31 + lVar34 * 4) == -1) break;
          uVar3 = *(uint *)(lVar31 + -0x10 + lVar34 * 4);
          this = (context->scene->geometries).items[uVar3].ptr;
          context->geomID = uVar3;
          context->primID = *(uint *)(lVar31 + lVar34 * 4);
          auVar43 = ZEXT1664(auVar43._0_16_);
          auVar49 = ZEXT1664(auVar49._0_16_);
          auVar54 = ZEXT1664(auVar54._0_16_);
          auVar63 = ZEXT1664(auVar63._0_16_);
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
          bVar20 = Geometry::pointQuery(this,query,context);
          bVar32 = bVar32 | bVar20;
          lVar34 = lVar34 + 1;
        } while (lVar34 != 4);
        lVar24 = lVar24 + 1;
        lVar31 = lVar31 + 0x50;
        bVar19 = bVar25 | bVar32;
      } while (lVar24 != uVar23 - 8);
      auVar75 = ZEXT1664(local_2490);
    } while (bVar25 == 0 && bVar32 == 0);
    uVar33 = *(undefined4 *)&(context->query_radius).field_0;
    auVar37._4_4_ = uVar33;
    auVar37._0_4_ = uVar33;
    auVar37._8_4_ = uVar33;
    auVar37._12_4_ = uVar33;
    auVar37._16_4_ = uVar33;
    auVar37._20_4_ = uVar33;
    auVar37._24_4_ = uVar33;
    auVar37._28_4_ = uVar33;
    uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar40._4_4_ = uVar33;
    auVar40._0_4_ = uVar33;
    auVar40._8_4_ = uVar33;
    auVar40._12_4_ = uVar33;
    auVar40._16_4_ = uVar33;
    auVar40._20_4_ = uVar33;
    auVar40._24_4_ = uVar33;
    auVar40._28_4_ = uVar33;
    uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar45._4_4_ = uVar33;
    auVar45._0_4_ = uVar33;
    auVar45._8_4_ = uVar33;
    auVar45._12_4_ = uVar33;
    auVar45._16_4_ = uVar33;
    auVar45._20_4_ = uVar33;
    auVar45._24_4_ = uVar33;
    auVar45._28_4_ = uVar33;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar75 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar35 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar75 = ZEXT1664(auVar35);
    }
    bVar21 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }